

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatIndexBuilder.cpp
# Opt level: O0

void __thiscall
FlatIndexBuilder::add_file(FlatIndexBuilder *this,FileId fid,uint8_t *data,size_t size)

{
  IndexType *pIVar1;
  TrigramGenerator p_Var2;
  function<void_(unsigned_int)> *in_RCX;
  anon_class_16_2_633b7b2e *in_RDX;
  IndexBuilder *in_RDI;
  TrigramGenerator generator;
  undefined8 in_stack_ffffffffffffff88;
  IndexType type;
  TrigramCallback *pTVar3;
  TrigramCallback local_48;
  TrigramGenerator local_28;
  function<void_(unsigned_int)> *local_20;
  anon_class_16_2_633b7b2e *local_18;
  uint local_c [3];
  
  type = (IndexType)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_20 = in_RCX;
  local_18 = in_RDX;
  pIVar1 = std::max<unsigned_int>(local_c,&in_RDI[2].ntype);
  in_RDI[2].ntype = *pIVar1;
  IndexBuilder::index_type(in_RDI);
  p_Var2 = get_generator_for(type);
  pTVar3 = &local_48;
  local_28 = p_Var2;
  std::function<void(unsigned_int)>::
  function<FlatIndexBuilder::add_file(unsigned_int,unsigned_char_const*,unsigned_long)::__0,void>
            (local_20,local_18);
  (*p_Var2)((uint8_t *)local_18,(uint64_t)local_20,pTVar3);
  std::function<void_(unsigned_int)>::~function((function<void_(unsigned_int)> *)0x209c8c);
  return;
}

Assistant:

void FlatIndexBuilder::add_file(FileId fid, const uint8_t *data, size_t size) {
    max_fileid_ = std::max(fid, max_fileid_);
    TrigramGenerator generator = get_generator_for(index_type());
    generator(data, size, [&](TriGram val) { add_trigram(fid, val); });
}